

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

vector<picnic_params_t,_std::allocator<picnic_params_t>_> * all_supported_parameters(void)

{
  undefined8 in_RAX;
  size_t sVar1;
  vector<picnic_params_t,_std::allocator<picnic_params_t>_> *in_RDI;
  long lVar2;
  picnic_params_t_conflict param;
  undefined8 uStack_28;
  
  (in_RDI->super__Vector_base<picnic_params_t,_std::allocator<picnic_params_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->super__Vector_base<picnic_params_t,_std::allocator<picnic_params_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<picnic_params_t,_std::allocator<picnic_params_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uStack_28 = in_RAX;
  for (lVar2 = 0; lVar2 != 0x30; lVar2 = lVar2 + 4) {
    uStack_28 = CONCAT44(*(picnic_params_t *)((long)&(anonymous_namespace)::all_parameters + lVar2),
                         (undefined4)uStack_28);
    sVar1 = picnic_signature_size
                      (*(picnic_params_t *)((long)&(anonymous_namespace)::all_parameters + lVar2));
    if (sVar1 != 0) {
      std::vector<picnic_params_t,_std::allocator<picnic_params_t>_>::push_back
                (in_RDI,(value_type *)((long)&uStack_28 + 4));
    }
  }
  return in_RDI;
}

Assistant:

std::vector<picnic_params_t> all_supported_parameters() {
  std::vector<picnic_params_t> res;
  for (const auto param : all_parameters) {
    if (picnic_signature_size(param)) {
      res.push_back(param);
    }
  }
  return res;
}